

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
tinyusdz::Prim::get_child_indices_from_primChildren
          (Prim *this,bool force_update,bool *indices_is_valid)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  PrimMeta *pPVar5;
  iterator __first;
  const_reference this_00;
  string *psVar6;
  const_reference this_01;
  pointer ppVar7;
  unsigned_long *puVar8;
  reference pvVar9;
  size_type sVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar11;
  _Self local_f0;
  _Self local_e8;
  iterator it;
  string tok;
  size_t i_1;
  undefined1 local_b0 [7];
  bool valid;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> table;
  unsigned_long local_70;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  m;
  bool *indices_is_valid_local;
  bool force_update_local;
  Prim *this_local;
  
  if (!force_update) {
    sVar3 = ::std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices);
    sVar4 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children);
    if ((sVar3 == sVar4) && ((this->_child_dirty & 1U) == 0)) {
      if (indices_is_valid != (bool *)0x0) {
        *indices_is_valid = (bool)(this->_primChildrenIndicesIsValid & 1);
      }
      goto LAB_0037a8c3;
    }
  }
  if (!force_update) {
    this->_child_dirty = false;
  }
  pPVar5 = metas(this);
  bVar2 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::empty
                    (&pPVar5->primChildren);
  if (bVar2) {
    sVar3 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children);
    ::std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices,sVar3);
    __first = std::vector<long,_std::allocator<long>_>::begin
                        ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices);
    m._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<long,_std::allocator<long>_>::end
                           ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices);
    ::std::iota<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,int>
              ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               __first._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               m._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    this->_primChildrenIndicesIsValid = true;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = (bool)(this->_primChildrenIndicesIsValid & 1);
    }
  }
  else {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)&i);
    for (local_70 = 0; uVar1 = local_70,
        sVar3 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                          (&this->_children), uVar1 < sVar3; local_70 = local_70 + 1) {
      this_00 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                          (&this->_children,local_70);
      psVar6 = element_name_abi_cxx11_(this_00);
      pVar11 = ::std::
               map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::emplace<std::__cxx11::string_const&,unsigned_long&>
                         ((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)&i,psVar6,&local_70);
      table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar11.first._M_node;
    }
    ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_b0);
    pPVar5 = metas(this);
    sVar3 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      (&pPVar5->primChildren);
    ::std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices,sVar3);
    i_1._7_1_ = true;
    for (tok.field_2._8_8_ = 0;
        sVar3 = ::std::vector<long,_std::allocator<long>_>::size
                          ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices),
        (ulong)tok.field_2._8_8_ < sVar3; tok.field_2._8_8_ = tok.field_2._8_8_ + 1) {
      pPVar5 = metas(this);
      this_01 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                          (&pPVar5->primChildren,tok.field_2._8_8_);
      psVar6 = Token::str_abi_cxx11_(this_01);
      ::std::__cxx11::string::string((string *)&it,(string *)psVar6);
      local_e8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)&i,(key_type_conflict *)&it);
      local_f0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)&i);
      bVar2 = ::std::operator!=(&local_e8,&local_f0);
      if (bVar2) {
        ppVar7 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->(&local_e8);
        uVar1 = ppVar7->second;
        puVar8 = (unsigned_long *)
                 ::std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices,
                            tok.field_2._8_8_);
        *puVar8 = uVar1;
        ppVar7 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->(&local_e8);
        ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_b0,&ppVar7->second);
      }
      else {
        pvVar9 = ::std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices,
                            tok.field_2._8_8_);
        *pvVar9 = -1;
        i_1._7_1_ = false;
      }
      ::std::__cxx11::string::~string((string *)&it);
    }
    sVar10 = ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_b0);
    sVar3 = ::std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices);
    if (sVar10 != sVar3) {
      i_1._7_1_ = false;
    }
    this->_primChildrenIndicesIsValid = i_1._7_1_;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = (bool)(this->_primChildrenIndicesIsValid & 1);
    }
    ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_b0);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            *)&i);
  }
LAB_0037a8c3:
  this_local = (Prim *)&this->_primChildrenIndices;
  return (vector<long,_std::allocator<long>_> *)this_local;
}

Assistant:

const std::vector<int64_t> &Prim::get_child_indices_from_primChildren(
    bool force_update, bool *indices_is_valid) const {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (!force_update && (_primChildrenIndices.size() == _children.size()) &&
      !_child_dirty) {
    // got cache.
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  if (!force_update) {
    _child_dirty = false;
  }

  if (metas().primChildren.empty()) {
    _primChildrenIndices.resize(_children.size());
    std::iota(_primChildrenIndices.begin(), _primChildrenIndices.end(), 0);
    _primChildrenIndicesIsValid = true;
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  std::map<std::string, size_t> m;  // name -> children() index map
  for (size_t i = 0; i < _children.size(); i++) {
    m.emplace(_children[i].element_name(), i);
  }
  std::set<size_t> table;  // to check uniqueness

  // Use the length of primChildren.
  _primChildrenIndices.resize(metas().primChildren.size());

  bool valid = true;

  for (size_t i = 0; i < _primChildrenIndices.size(); i++) {
    std::string tok = metas().primChildren[i].str();
    const auto it = m.find(tok);
    if (it != m.end()) {
      _primChildrenIndices[i] = int64_t(it->second);

      table.insert(it->second);
    } else {
      // Prim name not found.
      _primChildrenIndices[i] = -1;
      valid = false;
    }
  }

  if (table.size() != _primChildrenIndices.size()) {
    // duplicated index exists.
    valid = false;
  }

  _primChildrenIndicesIsValid = valid;
  if (indices_is_valid) {
    (*indices_is_valid) = _primChildrenIndicesIsValid;
  }

  return _primChildrenIndices;
}